

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O2

void radixpass_u32(uint32_t *hist,uint32_t shift,uint32_t mask,uint32_t *keys_in,uint32_t *keys_out,
                  uint32_t *values_in,uint32_t *values_out,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  uint32_t i;
  ulong uVar3;
  uint uVar4;
  
  for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = keys_in[uVar3];
    uVar4 = uVar1 >> ((byte)shift & 0x1f) & mask;
    uVar2 = hist[uVar4];
    hist[uVar4] = uVar2 + 1;
    keys_out[uVar2] = uVar1;
    values_out[uVar2] = values_in[uVar3];
  }
  return;
}

Assistant:

static inline void radixpass_u32(uint32_t* restrict hist, uint32_t shift, uint32_t mask,
    const uint32_t* restrict keys_in, uint32_t* restrict keys_out,
    const uint32_t* restrict values_in, uint32_t* restrict values_out, uint32_t size)
{
    for (uint32_t i = 0; i < size; ++i)
    {
        const uint32_t key = keys_in[i];
        const uint32_t pos = (key >> shift) & mask;
        const uint32_t index = hist[pos]++;
        keys_out[index] = key;
        values_out[index] = values_in[i];
    }
}